

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
 __thiscall absl::lts_20240722::flags_internal::FlagImpl::SaveState(FlagImpl *this)

{
  FlagOpFn op;
  FlagValueStorageKind FVar1;
  Mutex *mu;
  atomic<long> *paVar2;
  FlagHelpMsg dst;
  atomic<unsigned_long> *src;
  size_t size;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *this_00;
  void *obj;
  FlagImpl *in_RSI;
  MaskedPointer local_a8;
  void *local_a0;
  undefined1 local_98 [31];
  undefined1 local_79;
  FlagHelpMsg FStack_78;
  bool success;
  void *cloned;
  __atomic_base<long> local_68;
  __atomic_base<long> local_60;
  undefined1 local_58 [31];
  bool local_39;
  bool on_command_line;
  bool modified;
  MutexLock l;
  FlagImpl *this_local;
  memory_order __b;
  
  mu = DataGuard(in_RSI);
  MutexLock::MutexLock((MutexLock *)&stack0xffffffffffffffc8,mu);
  local_39 = (bool)((byte)in_RSI->field_0x29 >> 2 & 1);
  local_58[0x1e] = (byte)in_RSI->field_0x29 >> 3 & 1;
  FVar1 = ValueStorageKind(in_RSI);
  if (FVar1 < kSequenceLocked) {
    paVar2 = OneWordValue(in_RSI);
    std::operator&(memory_order_acquire,__memory_order_mask);
    local_60._M_i = (paVar2->super___atomic_base<long>)._M_i;
    local_68._M_i = ModificationCount(in_RSI);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,long,bool&,bool&,long>
              ((FlagImpl *)local_58,(long *)in_RSI,(bool *)&local_60,&local_39,
               (long *)(local_58 + 0x1e));
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
    ::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,std::default_delete<absl::lts_20240722::flags_internal::FlagState>,void>
              ((unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
                *)this,(unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                        *)local_58);
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                   *)local_58);
  }
  else if (FVar1 == kSequenceLocked) {
    dst.literal = (char *)Alloc(in_RSI->op_);
    FStack_78.literal = dst.literal;
    src = AtomicBufferValue(in_RSI);
    size = Sizeof(in_RSI->op_);
    local_79 = SequenceLock::TryRead(&in_RSI->seq_lock_,dst.literal,src,size);
    if (!(bool)local_79) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                    ,0x1bd,
                    "virtual std::unique_ptr<FlagStateInterface> absl::flags_internal::FlagImpl::SaveState()"
                   );
    }
    local_98._8_8_ = ModificationCount(in_RSI);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,void*&,bool&,bool&,long>
              ((FlagImpl *)(local_98 + 0x10),(void **)in_RSI,(bool *)&stack0xffffffffffffff88,
               &local_39,(long *)(local_58 + 0x1e));
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
    ::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,std::default_delete<absl::lts_20240722::flags_internal::FlagState>,void>
              ((unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
                *)this,(unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                        *)(local_98 + 0x10));
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                   *)(local_98 + 0x10));
  }
  else if (FVar1 == kHeapAllocated) {
    op = in_RSI->op_;
    this_00 = PtrStorage(in_RSI);
    local_a8 = std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::load
                         (this_00,memory_order_acquire);
    obj = MaskedPointer::Ptr(&local_a8);
    local_a0 = Clone(op,obj);
    ModificationCount(in_RSI);
    std::
    make_unique<absl::lts_20240722::flags_internal::FlagState,absl::lts_20240722::flags_internal::FlagImpl&,void*,bool&,bool&,long>
              ((FlagImpl *)local_98,(void **)in_RSI,(bool *)&local_a0,&local_39,
               (long *)(local_58 + 0x1e));
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
    ::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,std::default_delete<absl::lts_20240722::flags_internal::FlagState>,void>
              ((unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
                *)this,(unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                        *)local_98);
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::flags_internal::FlagState,_std::default_delete<absl::lts_20240722::flags_internal::FlagState>_>
                   *)local_98);
  }
  else {
    std::
    unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
    ::unique_ptr<std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,void>
              ((unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>>
                *)this,(nullptr_t)0x0);
  }
  cloned._4_4_ = 1;
  MutexLock::~MutexLock((MutexLock *)&stack0xffffffffffffffc8);
  return (__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FlagStateInterface> FlagImpl::SaveState() {
  absl::MutexLock l(DataGuard());

  bool modified = modified_;
  bool on_command_line = on_command_line_;
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      return absl::make_unique<FlagState>(
          *this, OneWordValue().load(std::memory_order_acquire), modified,
          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kSequenceLocked: {
      void* cloned = flags_internal::Alloc(op_);
      // Read is guaranteed to be successful because we hold the lock.
      bool success =
          seq_lock_.TryRead(cloned, AtomicBufferValue(), Sizeof(op_));
      assert(success);
      static_cast<void>(success);
      return absl::make_unique<FlagState>(*this, cloned, modified,
                                          on_command_line, ModificationCount());
    }
    case FlagValueStorageKind::kHeapAllocated: {
      return absl::make_unique<FlagState>(
          *this,
          flags_internal::Clone(
              op_, PtrStorage().load(std::memory_order_acquire).Ptr()),
          modified, on_command_line, ModificationCount());
    }
  }
  return nullptr;
}